

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFile1.unit.cpp
# Opt level: O2

void __thiscall TestFile1_TestParseFile_Test::TestBody(TestFile1_TestParseFile_Test *this)

{
  variant_alternative_t<0UL,_variant<vector<WLData,_allocator<WLData>_>,_DualBandBSDF>_> *pvVar1;
  AssertHelper expr1;
  AssertHelper val2;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  initializer_list<OpticsParser::WLData> __l;
  char *in_stack_fffffffffffff388;
  AssertHelper in_stack_fffffffffffff390;
  vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> correctResults;
  AssertHelper in_stack_fffffffffffff3b0;
  double dStack_c48;
  Parser parser;
  AssertionResult gtest_ar;
  WLData local_bc8;
  WLData local_b58;
  WLData local_ae8;
  WLData local_a78;
  WLData local_a08;
  string inputFile;
  ProductData productData;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputFile,"InputFile1.dat",(allocator<char> *)&productData);
  OpticsParser::Parser::parseFile(&productData,&parser,&inputFile);
  if (productData.thickness.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_fffffffffffff390.data_,in_stack_fffffffffffff388,
             (char *)CONCAT44(correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
             (double)in_stack_fffffffffffff3b0.data_,
             (double)correctResults.
                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&correctResults);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
    if ((long *)CONCAT44(correctResults.
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         correctResults.
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(correctResults.
                                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     correctResults.
                                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (productData.conductivity.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_fffffffffffff390.data_,in_stack_fffffffffffff388,
             (char *)CONCAT44(correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
             (double)in_stack_fffffffffffff3b0.data_,
             (double)correctResults.
                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&correctResults);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
    if ((long *)CONCAT44(correctResults.
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         correctResults.
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(correctResults.
                                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     correctResults.
                                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (productData.IRTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_fffffffffffff390.data_,in_stack_fffffffffffff388,
             (char *)CONCAT44(correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
             (double)in_stack_fffffffffffff3b0.data_,
             (double)correctResults.
                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&correctResults);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
    if ((long *)CONCAT44(correctResults.
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         correctResults.
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(correctResults.
                                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     correctResults.
                                     super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (productData.frontEmissivity.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged != false) {
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_fffffffffffff390.data_,in_stack_fffffffffffff388,
               (char *)CONCAT44(correctResults.
                                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                correctResults.
                                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
               (double)in_stack_fffffffffffff3b0.data_,
               (double)correctResults.
                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&correctResults);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
      if ((long *)CONCAT44(correctResults.
                           super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           correctResults.
                           super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(correctResults.
                                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       correctResults.
                                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (productData.backEmissivity.super__Optional_base<double,_true,_true>._M_payload.
        super__Optional_payload_base<double>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_fffffffffffff390.data_,in_stack_fffffffffffff388,
               (char *)CONCAT44(correctResults.
                                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                correctResults.
                                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
               (double)in_stack_fffffffffffff3b0.data_,
               (double)correctResults.
                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&correctResults);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                 ,0x61,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
      if ((long *)CONCAT44(correctResults.
                           super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           correctResults.
                           super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(correctResults.
                                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       correctResults.
                                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    correctResults.super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x66;
    if (productData.nfrcid.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged != false) {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"102","productData.nfrcid.value()",(int *)&correctResults,
                 (int *)&productData.nfrcid);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&correctResults);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                   ,0x62,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
        if ((long *)CONCAT44(correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<char[20],std::optional<std::__cxx11::string>>
                ((internal *)&gtest_ar,"\"Generic Clear Glass\"","productData.productName",
                 (char (*) [20])"Generic Clear Glass",&productData.productName);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&correctResults);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                   ,99,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
        if ((long *)CONCAT44(correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
                ((internal *)&gtest_ar,"\"glazing\"","productData.productType",
                 (char (*) [8])"glazing",&productData.productType);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&correctResults);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                   ,100,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
        if ((long *)CONCAT44(correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<char[11],std::optional<std::__cxx11::string>>
                ((internal *)&gtest_ar,"\"Monolithic\"","productData.productSubtype",
                 (char (*) [11])"Monolithic",&productData.productSubtype);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&correctResults);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                   ,0x65,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff390,(Message *)&correctResults);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff390);
        if ((long *)CONCAT44(correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         correctResults.
                                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      OpticsParser::WLData::WLData((WLData *)&gtest_ar,0.3,0.002,0.047,0.048);
      OpticsParser::WLData::WLData(&local_bc8,0.305,0.003,0.047,0.048);
      OpticsParser::WLData::WLData(&local_b58,0.31,0.009,0.047,0.048);
      OpticsParser::WLData::WLData(&local_ae8,0.315,0.035,0.047,0.048);
      OpticsParser::WLData::WLData(&local_a78,0.32,0.1,0.047,0.048);
      OpticsParser::WLData::WLData(&local_a08,0.325,0.218,0.049,0.05);
      __l._M_len = 6;
      __l._M_array = (iterator)&gtest_ar;
      std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::vector
                (&correctResults,__l,(allocator_type *)&stack0xfffffffffffff390);
      if (productData.measurements.
          super__Optional_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_true,_false,_false>
          .
          super__Optional_payload_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
          ._M_engaged != false) {
        pvVar1 = std::
                 get<0ul,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                           ((variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
                             *)&productData.measurements);
        expr1.data_ = (AssertHelperData *)
                      (((long)correctResults.
                              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       CONCAT44(correctResults.
                                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                correctResults.
                                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x70);
        val2.data_ = (AssertHelperData *)
                     (((long)(pvVar1->
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar1->
                            super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x70);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"correctResults.size()","givenResults.size()",
                   (unsigned_long *)&stack0xfffffffffffff390,
                   (unsigned_long *)&stack0xfffffffffffff3b0);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&stack0xfffffffffffff390);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffff3b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                     ,0x6f,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffff3b0,(Message *)&stack0xfffffffffffff390);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff3b0);
          if (expr1.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)expr1.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        uVar2 = 0;
        while( true ) {
          uVar3 = (ulong)uVar2;
          if ((ulong)(((long)correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT44(correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x70) <= uVar3)
          break;
          lVar5 = uVar3 * 0x70;
          testing::internal::DoubleNearPredFormat
                    ((char *)expr1.data_,in_stack_fffffffffffff388,
                     (char *)CONCAT44(correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
                     (double)val2.data_,
                     (double)correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&stack0xfffffffffffff390);
            pcVar4 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff3b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                       ,0x72,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff3b0,(Message *)&stack0xfffffffffffff390)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff3b0)
            ;
            if (expr1.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)expr1.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          std::optional<OpticsParser::MeasurementComponent>::value
                    ((optional<OpticsParser::MeasurementComponent> *)
                     (CONCAT44(correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar5 + 8));
          std::optional<OpticsParser::MeasurementComponent>::value
                    (&(pvVar1->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar3].directComponent);
          testing::internal::DoubleNearPredFormat
                    ((char *)expr1.data_,in_stack_fffffffffffff388,
                     (char *)CONCAT44(correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
                     (double)val2.data_,
                     (double)correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&stack0xfffffffffffff390);
            pcVar4 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff3b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                       ,0x75,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff3b0,(Message *)&stack0xfffffffffffff390)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff3b0)
            ;
            if (expr1.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)expr1.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          std::optional<OpticsParser::MeasurementComponent>::value
                    ((optional<OpticsParser::MeasurementComponent> *)
                     (CONCAT44(correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar5 + 8));
          std::optional<OpticsParser::MeasurementComponent>::value
                    (&(pvVar1->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar3].directComponent);
          testing::internal::DoubleNearPredFormat
                    ((char *)expr1.data_,in_stack_fffffffffffff388,
                     (char *)CONCAT44(correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
                     (double)val2.data_,
                     (double)correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&stack0xfffffffffffff390);
            pcVar4 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff3b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                       ,0x78,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff3b0,(Message *)&stack0xfffffffffffff390)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff3b0)
            ;
            if (expr1.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)expr1.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          std::optional<OpticsParser::MeasurementComponent>::value
                    ((optional<OpticsParser::MeasurementComponent> *)
                     (CONCAT44(correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               correctResults.
                               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar5 + 8));
          std::optional<OpticsParser::MeasurementComponent>::value
                    (&(pvVar1->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar3].directComponent);
          testing::internal::DoubleNearPredFormat
                    ((char *)expr1.data_,in_stack_fffffffffffff388,
                     (char *)CONCAT44(correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      correctResults.
                                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_),dStack_c48,
                     (double)val2.data_,
                     (double)correctResults.
                             super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&stack0xfffffffffffff390);
            pcVar4 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff3b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                       ,0x7b,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff3b0,(Message *)&stack0xfffffffffffff390)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff3b0)
            ;
            if (expr1.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)expr1.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          uVar2 = uVar2 + 1;
        }
        std::_Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::
        ~_Vector_base(&correctResults.
                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                     );
        OpticsParser::ProductData::~ProductData(&productData);
        std::__cxx11::string::~string((string *)&inputFile);
        return;
      }
      std::__throw_bad_optional_access();
    }
    std::__throw_bad_optional_access();
  }
  std::__throw_bad_optional_access();
}

Assistant:

TEST_F(TestFile1, TestParseFile)
{
	const std::string inputFile = R"(InputFile1.dat)";
	OpticsParser::Parser parser;
	auto productData = parser.parseFile(inputFile);

	EXPECT_NEAR(3.048, productData.thickness.value(), 1e-6);
	EXPECT_NEAR(1, productData.conductivity.value(), 1e-6);
	EXPECT_NEAR(0, productData.IRTransmittance.value(), 1e-6);
	EXPECT_NEAR(0.84, productData.frontEmissivity.value(), 1e-6);
	EXPECT_NEAR(0.84, productData.backEmissivity.value(), 1e-6);
	EXPECT_EQ(102, productData.nfrcid.value());
	EXPECT_EQ("Generic Clear Glass", productData.productName);
	EXPECT_EQ("glazing", productData.productType);
	EXPECT_EQ("Monolithic", productData.productSubtype);
	std::vector<OpticsParser::WLData> correctResults{{0.300, 0.0020, 0.0470, 0.0480},
													 {0.305, 0.0030, 0.0470, 0.0480},
													 {0.310, 0.0090, 0.0470, 0.0480},
													 {0.315, 0.0350, 0.0470, 0.0480},
													 {0.320, 0.1000, 0.0470, 0.0480},
													 {0.325, 0.2180, 0.0490, 0.0500}};

	auto & givenResults =
		std::get<std::vector<OpticsParser::WLData>>(productData.measurements.value());
	EXPECT_EQ(correctResults.size(), givenResults.size());
	for(auto i = 0u; i < correctResults.size(); ++i)
	{
		EXPECT_NEAR(correctResults[i].wavelength, givenResults[i].wavelength, 1e-6);
		EXPECT_NEAR(correctResults[i].directComponent.value().tf,
			givenResults[i].directComponent.value().tf,
			1e-6);
		EXPECT_NEAR(correctResults[i].directComponent.value().rf,
			givenResults[i].directComponent.value().rf,
			1e-6);
		EXPECT_NEAR(correctResults[i].directComponent.value().rb,
			givenResults[i].directComponent.value().rb,
			1e-6);
	}
}